

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> __thiscall
testing::Return<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>
          (testing *this,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *value)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  undefined8 *puVar4;
  linked_ptr_internal extraout_RDX;
  ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> RVar5;
  
  pRVar1 = (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar3 = (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = pRVar1;
  puVar4[1] = pRVar2;
  puVar4[2] = pRVar3;
  *(undefined8 **)this = puVar4;
  *(testing **)(this + 8) = this + 8;
  RVar5.value_.link_.next_ = extraout_RDX.next_;
  RVar5.value_.value_ = (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)this;
  return (ReturnAction<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>)RVar5.value_;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(internal::move(value));
}